

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O2

size_t __thiscall
google::protobuf::RepeatedField<absl::lts_20240722::Cord>::SpaceUsedExcludingSelfLong
          (RepeatedField<absl::lts_20240722::Cord> *this)

{
  int iVar1;
  int iVar2;
  const_reference this_00;
  size_t sVar3;
  int i;
  size_t sVar4;
  
  iVar1 = size(this);
  sVar4 = (long)iVar1 << 4;
  iVar1 = 0;
  while( true ) {
    iVar2 = size(this);
    if (iVar2 <= iVar1) break;
    this_00 = Get(this,iVar1);
    sVar3 = absl::lts_20240722::Cord::InlineRep::size(&this_00->contents_);
    sVar4 = sVar4 + sVar3;
    iVar1 = iVar1 + 1;
  }
  return sVar4;
}

Assistant:

PROTOBUF_EXPORT_TEMPLATE_DEFINE size_t
RepeatedField<absl::Cord>::SpaceUsedExcludingSelfLong() const {
  size_t result = size() * sizeof(absl::Cord);
  for (int i = 0; i < size(); i++) {
    // Estimate only.
    result += Get(i).size();
  }
  return result;
}